

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O0

int __thiscall
bv::internal::bt_impl<2048UL,_(bv::allocation_policy_t)0>::access
          (bt_impl<2048UL,_(bv::allocation_policy_t)0> *this,char *__name,int __type)

{
  bool bVar1;
  uint uVar2;
  undefined7 extraout_var;
  ulong uVar3;
  int __type_00;
  size_t in_stack_00000058;
  subtree_ref_base<true> *in_stack_00000060;
  size_t new_index;
  size_t child;
  size_t in_stack_ffffffffffffff48;
  bitview<bv::internal::bitarray_t<2048UL>::array> *in_stack_ffffffffffffff50;
  pair<unsigned_long,_unsigned_long> *in_stack_ffffffffffffff58;
  tuple<unsigned_long_&,_unsigned_long_&> *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffffa8;
  subtree_ref_base<true> *in_stack_ffffffffffffffb0;
  char *local_38;
  value_type local_1;
  
  bVar1 = subtree_ref_base<true>::is_leaf((subtree_ref_base<true> *)&stack0x00000008);
  if (bVar1) {
    subtree_ref_base<true>::leaf((subtree_ref_base<true> *)0x1329f9);
    bitview<bv::internal::bitarray_t<2048UL>::array>::operator[]
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_1 = const_item_reference::operator_cast_to_bool
                        ((const_item_reference<bv::internal::bitview<bv::internal::bitarray_t<2048UL>::array>_>
                          *)0x132a26);
    uVar3 = CONCAT71(extraout_var,local_1);
  }
  else {
    subtree_ref_base<true>::find(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::tie<unsigned_long,unsigned_long>
              (&in_stack_ffffffffffffff58->first,(unsigned_long *)in_stack_ffffffffffffff50);
    std::tuple<unsigned_long&,unsigned_long&>::operator=
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    subtree_ref_base<true>::child(in_stack_00000060,in_stack_00000058);
    uVar2 = access(this,local_38,__type_00);
    uVar3 = (ulong)uVar2 & 0xffffffffffffff01;
    local_1 = SUB81(uVar3,0);
  }
  return (int)CONCAT71((int7)(uVar3 >> 8),local_1);
}

Assistant:

bool bt_impl<W, AP>::access(subtree_const_ref t, size_t index) const
        {
            assert(index < t.size() && "Index out of bounds");
            
            if(t.is_leaf()) // We have a leaf
                return t.leaf()[index];
            else { // We're in a node
                size_t child, new_index;
                tie(child, new_index) = t.find(index);
                
                return access(t.child(child), new_index);
            }
        }